

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O1

void __thiscall Sms_Apu::run_until(Sms_Apu *this,blip_time_t end_time)

{
  long lVar1;
  long lVar2;
  Sms_Square *this_00;
  
  if (this->last_time < end_time) {
    lVar2 = -4;
    this_00 = this->squares;
    do {
      lVar1 = this->squares[0].super_Sms_Osc.outputs[lVar2]->sample_rate_;
      if (lVar1 != 0) {
        *(undefined4 *)(lVar1 + 0x38) = 1;
        if (lVar2 == -1) {
          Sms_Noise::run(&this->noise,this->last_time,end_time);
        }
        else {
          Sms_Square::run(this_00,this->last_time,end_time);
        }
      }
      this_00 = this_00 + 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
    this->last_time = end_time;
  }
  return;
}

Assistant:

void Sms_Apu::run_until( blip_time_t end_time )
{
	require( end_time >= last_time ); // end_time must not be before previous time
	
	if ( end_time > last_time )
	{
		// run oscillators
		for ( int i = 0; i < osc_count; ++i )
		{
			Sms_Osc& osc = *oscs [i];
			if ( osc.output )
			{
				osc.output->set_modified();
				if ( i < 3 )
					squares [i].run( last_time, end_time );
				else
					noise.run( last_time, end_time );
			}
		}
		
		last_time = end_time;
	}
}